

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridDataType0.cpp
# Opt level: O1

void __thiscall KDIS::DATA_TYPE::GridDataType0::AddDataValue(GridDataType0 *this,KUINT8 D)

{
  undefined1 *puVar1;
  pointer *ppuVar2;
  iterator __position;
  uchar local_1;
  
  puVar1 = &(this->super_GridData).field_0xc;
  *(short *)puVar1 = *(short *)puVar1 + 1;
  __position._M_current =
       (this->m_vui8DataVals).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_vui8DataVals).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    _M_realloc_insert<unsigned_char_const&>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&this->m_vui8DataVals,
               __position,&local_1);
  }
  else {
    *__position._M_current = D;
    ppuVar2 = &(this->m_vui8DataVals).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppuVar2 = *ppuVar2 + 1;
  }
  return;
}

Assistant:

void GridDataType0::AddDataValue( KUINT8 D )
{
    ++m_ui16NumBytes;
    m_vui8DataVals.push_back( D );
}